

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O2

int ncnn::convolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  float *pfVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  float *pfVar11;
  float *pfVar12;
  float *extraout_RAX;
  float *extraout_RAX_00;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int j;
  void *pvVar23;
  float *pfVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  void *local_108;
  int local_fc;
  long local_f0;
  
  pvVar3 = bias_data->data;
  if (pvVar3 == (void *)0x0) {
    bVar26 = true;
  }
  else {
    bVar26 = (long)bias_data->c * bias_data->cstep == 0;
  }
  uVar2 = top_blob->w;
  if (top_blob->h == group && bottom_blob->h == group) {
    pvVar4 = top_blob->data;
    sVar5 = top_blob->elemsize;
    uVar20 = 0;
    uVar25 = 0;
    if (0 < kernel_w) {
      uVar25 = (ulong)(uint)kernel_w;
    }
    pvVar23 = weight_data->data;
    uVar22 = 0;
    if (0 < (int)uVar2) {
      uVar22 = (ulong)uVar2;
    }
    uVar17 = (ulong)(uint)group;
    if (group < 1) {
      uVar17 = uVar20;
    }
    pfVar11 = (float *)((long)kernel_w * 4);
    for (; uVar20 != uVar17; uVar20 = uVar20 + 1) {
      pfVar11 = (float *)(long)bottom_blob->w;
      pfVar6 = (float *)activation_params->data;
      pfVar24 = (float *)(bottom_blob->elemsize * uVar20 * (long)pfVar11 + (long)bottom_blob->data);
      for (uVar19 = 0; uVar19 != uVar22; uVar19 = uVar19 + 1) {
        uVar15 = 0;
        if (!bVar26) {
          uVar15 = (ulong)*(uint *)((long)pvVar3 + uVar20 * 4);
        }
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar15;
        uVar15 = 0;
        pfVar11 = pfVar24;
        while( true ) {
          fVar27 = auVar30._0_4_;
          if (uVar25 == uVar15) break;
          auVar30._0_4_ = fVar27 + *(float *)((long)pvVar23 + uVar15 * 4) * *pfVar11;
          uVar15 = uVar15 + 1;
          pfVar11 = pfVar11 + dilation_w;
        }
        pfVar12 = (float *)(ulong)(activation_type - 1U);
        pfVar11 = pfVar12;
        if (activation_type - 1U < 6) {
          pfVar11 = (float *)((long)&switchD_004af07f::switchdataD_004d1b4c +
                             (long)(int)(&switchD_004af07f::switchdataD_004d1b4c)[(long)pfVar12]);
          switch(pfVar12) {
          case (float *)0x0:
            if (fVar27 <= 0.0) {
              auVar7._12_4_ = 0;
              auVar7._0_12_ = auVar30._4_12_;
              auVar30 = auVar7 << 0x20;
            }
            goto LAB_004af089;
          case (float *)0x1:
            fVar28 = (float)(~-(uint)(0.0 < fVar27) & (uint)*pfVar6 |
                            -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27;
            pfVar11 = pfVar6;
            break;
          case (float *)0x2:
            if (fVar27 <= *pfVar6) {
              auVar30._0_4_ = *pfVar6;
            }
            fVar28 = pfVar6[1];
            pfVar11 = pfVar6;
            if (auVar30._0_4_ <= fVar28) {
              fVar28 = auVar30._0_4_;
            }
            break;
          case (float *)0x3:
            if (88.37626 <= fVar27) {
              fVar27 = 88.37626;
            }
            fVar27 = expf((float)(-(uint)(fVar27 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar27 < -88.37626) & (uint)-fVar27));
            pfVar11 = extraout_RAX_00;
            fVar28 = 1.0 / (fVar27 + 1.0);
            break;
          case (float *)0x4:
            fVar28 = expf(fVar27);
            fVar28 = logf(fVar28 + 1.0);
            fVar28 = tanhf(fVar28);
            pfVar11 = extraout_RAX;
            fVar28 = fVar28 * fVar27;
            break;
          case (float *)0x5:
            fVar1 = *pfVar6;
            fVar29 = -pfVar6[1] / fVar1;
            pfVar11 = pfVar6;
            fVar28 = 0.0;
            if (fVar29 <= fVar27) {
              if (fVar29 + 1.0 / fVar1 < fVar27) goto LAB_004af089;
              fVar28 = (fVar1 * fVar27 + pfVar6[1]) * fVar27;
            }
          }
        }
        else {
LAB_004af089:
          fVar28 = auVar30._0_4_;
        }
        *(float *)((long)pvVar4 + uVar19 * 4 + (long)(int)uVar2 * sVar5 * uVar20) = fVar28;
        pfVar24 = pfVar24 + stride_w;
      }
      pvVar23 = (void *)((long)pvVar23 + (long)kernel_w * 4);
    }
  }
  else {
    uVar20 = (long)bottom_blob->h / (long)group;
    uVar10 = top_blob->h / group;
    iVar14 = (int)uVar20;
    uVar8 = kernel_w;
    if (kernel_w < 1) {
      uVar8 = 0;
    }
    uVar25 = 0;
    if (0 < iVar14) {
      uVar25 = uVar20 & 0xffffffff;
    }
    uVar20 = 0;
    if (0 < (int)uVar2) {
      uVar20 = (ulong)uVar2;
    }
    uVar22 = 0;
    if (0 < (int)uVar10) {
      uVar22 = (ulong)uVar10;
    }
    local_f0 = 0;
    if (group < 1) {
      group = 0;
    }
    local_fc = 0;
    for (pfVar11 = (float *)0x0; pfVar11 != (float *)(ulong)(uint)group;
        pfVar11 = (float *)((long)pfVar11 + 1)) {
      pvVar4 = top_blob->data;
      sVar5 = top_blob->elemsize;
      local_108 = (void *)((long)local_fc * 4 + (long)weight_data->data);
      for (uVar17 = 0; uVar17 != uVar22; uVar17 = uVar17 + 1) {
        lVar16 = uVar17 + (long)pfVar11 * (long)(int)uVar10;
        pfVar6 = (float *)activation_params->data;
        lVar18 = 0;
        for (uVar19 = 0; uVar19 != uVar20; uVar19 = uVar19 + 1) {
          uVar15 = 0;
          if (!bVar26) {
            uVar15 = (ulong)*(uint *)((long)pvVar3 + lVar16 * 4);
          }
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar15;
          lVar13 = (long)bottom_blob->w * bottom_blob->elemsize;
          pfVar24 = (float *)(lVar13 * local_f0 + lVar18 + (long)bottom_blob->data);
          pvVar23 = local_108;
          for (uVar15 = 0; fVar27 = auVar31._0_4_, uVar15 != uVar25; uVar15 = uVar15 + 1) {
            pfVar12 = pfVar24;
            for (uVar21 = 0; uVar8 != uVar21; uVar21 = uVar21 + 1) {
              auVar31._0_4_ = auVar31._0_4_ + *(float *)((long)pvVar23 + uVar21 * 4) * *pfVar12;
              pfVar12 = pfVar12 + dilation_w;
            }
            pvVar23 = (void *)((long)pvVar23 + (long)kernel_w * 4);
            pfVar24 = (float *)((long)pfVar24 + lVar13);
          }
          switch(activation_type) {
          case 1:
            if (fVar27 <= 0.0) {
              auVar9._12_4_ = 0;
              auVar9._0_12_ = auVar31._4_12_;
              auVar31 = auVar9 << 0x20;
            }
          default:
switchD_004af419_default:
            fVar28 = auVar31._0_4_;
            break;
          case 2:
            fVar28 = (float)(~-(uint)(0.0 < fVar27) & (uint)*pfVar6 |
                            -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27;
            break;
          case 3:
            if (fVar27 <= *pfVar6) {
              auVar31._0_4_ = *pfVar6;
            }
            fVar28 = pfVar6[1];
            if (auVar31._0_4_ <= fVar28) {
              fVar28 = auVar31._0_4_;
            }
            break;
          case 4:
            if (88.37626 <= fVar27) {
              fVar27 = 88.37626;
            }
            fVar27 = expf((float)(-(uint)(fVar27 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar27 < -88.37626) & (uint)-fVar27));
            fVar28 = 1.0 / (fVar27 + 1.0);
            break;
          case 5:
            fVar28 = expf(fVar27);
            fVar28 = logf(fVar28 + 1.0);
            fVar28 = tanhf(fVar28);
            fVar28 = fVar28 * fVar27;
            break;
          case 6:
            fVar1 = *pfVar6;
            fVar29 = -pfVar6[1] / fVar1;
            fVar28 = 0.0;
            if (fVar29 <= fVar27) {
              if (fVar29 + 1.0 / fVar1 < fVar27) goto switchD_004af419_default;
              fVar28 = (fVar1 * fVar27 + pfVar6[1]) * fVar27;
            }
          }
          *(float *)((long)pvVar4 + uVar19 * 4 + sVar5 * (long)(int)uVar2 * lVar16) = fVar28;
          lVar18 = lVar18 + (long)stride_w * 4;
        }
        local_108 = (void *)((long)local_108 + (long)(iVar14 * kernel_w) * 4);
      }
      local_fc = local_fc + uVar10 * iVar14 * kernel_w;
      local_f0 = local_f0 + iVar14;
    }
  }
  return (int)pfVar11;
}

Assistant:

static int convolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[g];

                const float* sptr = bottom_blob.row(g) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float w = kptr[k];
                    sum += val * w;

                    sptr += dilation_w;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    else
    {
        // group convolution
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                float* outptr = top_blob.row(g * outh_g + p);
                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[outh_g * g + p];

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float* sptr = bottom_blob.row(h_g * g + q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = *sptr;
                            float w = kptr[k];
                            sum += val * w;

                            sptr += dilation_w;
                        }

                        kptr += kernel_w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }
            }
        }
    }

    return 0;
}